

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp.cpp
# Opt level: O1

lzham_compress_status_t
lzham::lzham_lib_compress2
          (lzham_compress_state_ptr p,lzham_uint8 *pIn_buf,size_t *pIn_buf_size,
          lzham_uint8 *pOut_buf,size_t *pOut_buf_size,lzham_flush_t flush_type)

{
  lzcompressor *this;
  bool bVar1;
  lzham_compress_status_t lVar2;
  ulong uVar3;
  ulong uVar4;
  lzham_compress_state *pState;
  ulong uVar5;
  ulong __n;
  
  if (p == (lzham_compress_state_ptr)0x0) {
    return LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  if (*(int *)((long)p + 0xc0f684) == 0) {
    return LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  if (pOut_buf_size == (size_t *)0x0) {
    return LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  if (pIn_buf_size == (size_t *)0x0) {
    return LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  if (2 < *(uint *)((long)p + 0xc0f6b8)) {
    return LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  if ((pIn_buf == (lzham_uint8 *)0x0) && (*pIn_buf_size != 0)) {
    return LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  uVar5 = *pOut_buf_size;
  if (pOut_buf == (lzham_uint8 *)0x0 || uVar5 == 0) {
    return LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  uVar4 = *(ulong *)((long)p + 0xc0f670);
  uVar3 = *(uint *)((long)p + 0x43b0) - uVar4;
  if (*(uint *)((long)p + 0x43b0) < uVar4 || uVar3 == 0) {
    uVar5 = 0;
  }
  else {
    if (uVar3 < uVar5) {
      uVar5 = uVar3;
    }
    memcpy(pOut_buf,(void *)(uVar4 + *(long *)((long)p + 0x43a8)),uVar5);
    uVar4 = *(long *)((long)p + 0xc0f670) + uVar5;
    *(ulong *)((long)p + 0xc0f670) = uVar4;
    if (uVar4 < *(uint *)((long)p + 0x43b0)) {
      *pIn_buf_size = 0;
      *pOut_buf_size = uVar5;
      *(undefined4 *)((long)p + 0xc0f6b8) = 2;
      return LZHAM_COMP_STATUS_HAS_MORE_OUTPUT;
    }
    pOut_buf = pOut_buf + uVar5;
    *pOut_buf_size = *pOut_buf_size - uVar5;
  }
  if (*(int *)((long)p + 0x43b0) != 0) {
    *(undefined4 *)((long)p + 0x43b0) = 0;
  }
  *(undefined8 *)((long)p + 0xc0f670) = 0;
  uVar4 = *pIn_buf_size;
  if (*(char *)((long)p + 0xc0f678) == '\x01') {
    if (flush_type == LZHAM_FINISH && uVar4 == 0) {
      *pIn_buf_size = 0;
      *pOut_buf_size = uVar5;
      *(undefined4 *)((long)p + 0xc0f6b8) = 3;
      return LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE;
    }
    *(undefined4 *)((long)p + 0xc0f6b8) = 6;
    return LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  this = (lzcompressor *)((long)p + 0xa58);
  uVar3 = 0x400000;
  if (uVar4 < 0x400000) {
    uVar3 = uVar4;
  }
  if ((uVar4 != 0) && (bVar1 = lzcompressor::put_bytes(this,pIn_buf,(uint)uVar3), !bVar1)) {
LAB_00105e8b:
    *pIn_buf_size = 0;
    *pOut_buf_size = uVar5;
LAB_00105e95:
    *(undefined4 *)((long)p + 0xc0f6b8) = 4;
    return LZHAM_COMP_STATUS_FAILED;
  }
  if (flush_type != LZHAM_NO_FLUSH && uVar4 < 0x400001) {
    if ((flush_type < 0xb) && ((0x40cU >> (flush_type & 0x1f) & 1) != 0)) {
      bVar1 = lzcompressor::flush(this,flush_type);
      if (!bVar1) goto LAB_00105e8b;
    }
    else if (*(char *)((long)p + 0xc0f678) == '\0') {
      bVar1 = lzcompressor::put_bytes(this,(void *)0x0,0);
      if (!bVar1) {
        *pIn_buf_size = 0;
        *pOut_buf_size = uVar5;
        goto LAB_00105e95;
      }
      *(undefined1 *)((long)p + 0xc0f678) = 1;
    }
  }
  __n = (ulong)*(uint *)((long)p + 0x43b0) - *(long *)((long)p + 0xc0f670);
  if (*pOut_buf_size <= __n) {
    __n = *pOut_buf_size;
  }
  if (__n != 0) {
    memcpy(pOut_buf,(void *)(*(long *)((long)p + 0xc0f670) + *(long *)((long)p + 0x43a8)),__n);
    *(long *)((long)p + 0xc0f670) = *(long *)((long)p + 0xc0f670) + __n;
  }
  *pIn_buf_size = uVar3;
  *pOut_buf_size = __n + uVar5;
  uVar5 = *(ulong *)((long)p + 0xc0f670);
  uVar3 = (ulong)*(uint *)((long)p + 0x43b0);
  if (flush_type == LZHAM_FINISH && uVar3 <= uVar5) {
    if (uVar5 < uVar3 || *(byte *)((long)p + 0xc0f678) != 0) {
      lVar2 = *(byte *)((long)p + 0xc0f678) | LZHAM_COMP_STATUS_HAS_MORE_OUTPUT;
      goto LAB_00105f8f;
    }
  }
  else {
    lVar2 = LZHAM_COMP_STATUS_HAS_MORE_OUTPUT;
    if (uVar5 < uVar3) goto LAB_00105f8f;
  }
  lVar2 = (lzham_compress_status_t)(flush_type == LZHAM_NO_FLUSH && uVar4 < 0x400001);
LAB_00105f8f:
  *(lzham_compress_status_t *)((long)p + 0xc0f6b8) = lVar2;
  return lVar2;
}

Assistant:

lzham_compress_status_t LZHAM_CDECL lzham_lib_compress2(
      lzham_compress_state_ptr p,
      const lzham_uint8 *pIn_buf, size_t *pIn_buf_size,
      lzham_uint8 *pOut_buf, size_t *pOut_buf_size,
      lzham_flush_t flush_type)
   {
      lzham_compress_state *pState = static_cast<lzham_compress_state*>(p);

      if ((!pState) || (!pState->m_params.m_dict_size_log2) || (pState->m_status >= LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE) || (!pIn_buf_size) || (!pOut_buf_size))
      {
         LZHAM_LOG_ERROR(6012);
         return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      }

      if ((*pIn_buf_size) && (!pIn_buf))
      {
         LZHAM_LOG_ERROR(6013);
         return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      }

      if ((!*pOut_buf_size) || (!pOut_buf))
      {
         LZHAM_LOG_ERROR(6014);
         return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      }

      byte_vec &comp_data = pState->m_compressor.get_compressed_data();
      size_t num_bytes_written_to_out_buf = 0;
      if (pState->m_comp_data_ofs < comp_data.size())
      {
         size_t n = LZHAM_MIN(comp_data.size() - pState->m_comp_data_ofs, *pOut_buf_size);

         memcpy(pOut_buf, comp_data.get_ptr() + pState->m_comp_data_ofs, n);

         pState->m_comp_data_ofs += n;

         const bool has_no_more_output = (pState->m_comp_data_ofs >= comp_data.size());
         if (has_no_more_output)
         {
            pOut_buf += n;
            *pOut_buf_size -= n;
            num_bytes_written_to_out_buf += n;
         }
         else
         {
            *pIn_buf_size = 0;
            *pOut_buf_size = n;
            pState->m_status = LZHAM_COMP_STATUS_HAS_MORE_OUTPUT;
            return pState->m_status;
         }
      }

      comp_data.try_resize(0);
      pState->m_comp_data_ofs = 0;

      if (pState->m_finished_compression)
      {
         if ((*pIn_buf_size) || (flush_type != LZHAM_FINISH))
         {
            pState->m_status = LZHAM_COMP_STATUS_INVALID_PARAMETER;
            LZHAM_LOG_ERROR(6015);
            return pState->m_status;
         }

         *pIn_buf_size = 0;
         *pOut_buf_size = num_bytes_written_to_out_buf;

         pState->m_status = LZHAM_COMP_STATUS_SUCCESS;
         return pState->m_status;
      }

      const size_t cMaxBytesToPutPerIteration = 4*1024*1024;
      size_t bytes_to_put = LZHAM_MIN(cMaxBytesToPutPerIteration, *pIn_buf_size);
      const bool consumed_entire_input_buf = (bytes_to_put == *pIn_buf_size);

      if (bytes_to_put)
      {
         if (!pState->m_compressor.put_bytes(pIn_buf, (uint)bytes_to_put))
         {
            *pIn_buf_size = 0;
            *pOut_buf_size = num_bytes_written_to_out_buf;
            pState->m_status = LZHAM_COMP_STATUS_FAILED;
            LZHAM_LOG_ERROR(6016);
            return pState->m_status;
         }
      }

      if ((consumed_entire_input_buf) && (flush_type != LZHAM_NO_FLUSH))
      {
         if ((flush_type == LZHAM_SYNC_FLUSH) || (flush_type == LZHAM_FULL_FLUSH) || (flush_type == LZHAM_TABLE_FLUSH))
         {
            if (!pState->m_compressor.flush(flush_type))
            {
               *pIn_buf_size = 0;
               *pOut_buf_size = num_bytes_written_to_out_buf;
               pState->m_status = LZHAM_COMP_STATUS_FAILED;
               LZHAM_LOG_ERROR(6017);
               return pState->m_status;
            }
         }
         else if (!pState->m_finished_compression)
         {
            if (!pState->m_compressor.put_bytes(NULL, 0))
            {
               *pIn_buf_size = 0;
               *pOut_buf_size = num_bytes_written_to_out_buf;
               pState->m_status = LZHAM_COMP_STATUS_FAILED;
               LZHAM_LOG_ERROR(6018);
               return pState->m_status;
            }
            pState->m_finished_compression = true;
         }
      }

      size_t num_comp_bytes_to_output = LZHAM_MIN(comp_data.size() - pState->m_comp_data_ofs, *pOut_buf_size);
      if (num_comp_bytes_to_output)
      {
         memcpy(pOut_buf, comp_data.get_ptr() + pState->m_comp_data_ofs, num_comp_bytes_to_output);

         pState->m_comp_data_ofs += num_comp_bytes_to_output;
      }

      *pIn_buf_size = bytes_to_put;
      *pOut_buf_size = num_bytes_written_to_out_buf + num_comp_bytes_to_output;

      const bool has_no_more_output = (pState->m_comp_data_ofs >= comp_data.size());
      if ((has_no_more_output) && (flush_type == LZHAM_FINISH) && (pState->m_finished_compression))
         pState->m_status = LZHAM_COMP_STATUS_SUCCESS;
      else if ((has_no_more_output) && (consumed_entire_input_buf) && (flush_type == LZHAM_NO_FLUSH))
         pState->m_status = LZHAM_COMP_STATUS_NEEDS_MORE_INPUT;
      else
         pState->m_status = has_no_more_output ? LZHAM_COMP_STATUS_NOT_FINISHED : LZHAM_COMP_STATUS_HAS_MORE_OUTPUT;

      return pState->m_status;
   }